

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_check_mandatory_tree
              (lyd_node *root,ly_ctx *ctx,lys_module **modules,int mod_count,int options)

{
  int iVar1;
  bool bVar2;
  uint local_40;
  uint local_3c;
  lys_node *plStack_38;
  int i;
  lys_node *siter;
  int options_local;
  int mod_count_local;
  lys_module **modules_local;
  ly_ctx *ctx_local;
  lyd_node *root_local;
  
  if ((root == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    __assert_fail("root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x354,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if ((options & 0x100U) != 0) {
    __assert_fail("!(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x355,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if ((options & 0xeU) != 0) {
    return 0;
  }
  modules_local = (lys_module **)ctx;
  if (ctx == (ly_ctx *)0x0) {
    modules_local = (lys_module **)root->schema->module->ctx;
  }
  if (((options & 0x10000ffU) == 0) || ((options & 1U) != 0)) {
    if ((options & 0x1000U) == 0) {
      if ((modules == (lys_module **)0x0) || (mod_count == 0)) {
        if ((options & 0x10000U) == 0) {
          local_40 = *(byte *)((long)modules_local + 0x84) - 1;
        }
        else {
          local_40 = (uint)*(byte *)((long)modules_local + 0x84);
        }
        for (local_3c = local_40; (int)local_3c < *(int *)((long)modules_local + 0x3c);
            local_3c = local_3c + 1) {
          if (((*(ushort *)
                 (*(long *)(modules_local[8]->padding2 + (long)(int)local_3c * 8 + -0x42) + 0x40) >>
                7 & 1) != 0) &&
             ((*(ushort *)
                (*(long *)(modules_local[8]->padding2 + (long)(int)local_3c * 8 + -0x42) + 0x40) >>
               6 & 1) == 0)) {
            for (plStack_38 = *(lys_node **)
                               (*(long *)(modules_local[8]->padding2 +
                                         (long)(int)local_3c * 8 + -0x42) + 0xa8);
                plStack_38 != (lys_node *)0x0; plStack_38 = plStack_38->next) {
              if (((plStack_38->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
                 (iVar1 = lyd_check_mandatory_subtree
                                    (root,(lyd_node *)0x0,(lyd_node *)0x0,plStack_38,1,options),
                 iVar1 != 0)) {
                return 1;
              }
            }
          }
        }
      }
      else {
        for (local_3c = 0; (int)local_3c < mod_count; local_3c = local_3c + 1) {
          for (plStack_38 = modules[(int)local_3c]->data; plStack_38 != (lys_node *)0x0;
              plStack_38 = plStack_38->next) {
            if (((plStack_38->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
               (iVar1 = lyd_check_mandatory_subtree
                                  (root,(lyd_node *)0x0,(lyd_node *)0x0,plStack_38,1,options),
               iVar1 != 0)) {
              return 1;
            }
          }
        }
      }
    }
    else if ((root != (lyd_node *)0x0) &&
            (iVar1 = lyd_check_mandatory_subtree
                               (root,(lyd_node *)0x0,(lyd_node *)0x0,root->schema,1,options),
            iVar1 != 0)) {
      return 1;
    }
  }
  else if ((options & 0x40U) == 0) {
    if ((options & 0x30U) == 0) {
      if ((options & 0x1000000U) == 0) {
        ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x399);
        return 1;
      }
      if ((root != (lyd_node *)0x0) &&
         (iVar1 = lyd_check_mandatory_subtree
                            (root,(lyd_node *)0x0,(lyd_node *)0x0,root->schema,1,options),
         iVar1 != 0)) {
        return 1;
      }
    }
    else {
      if ((root == (lyd_node *)0x0) ||
         ((root->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
        ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,
               "Subtree is not a single RPC/action/reply.");
        return 1;
      }
      if ((options & 0x10U) == 0) {
        plStack_38 = root->schema->child;
        while( true ) {
          bVar2 = false;
          if (plStack_38 != (lys_node *)0x0) {
            bVar2 = plStack_38->nodetype != LYS_OUTPUT;
          }
          if (!bVar2) break;
          plStack_38 = plStack_38->next;
        }
      }
      else {
        plStack_38 = root->schema->child;
        while( true ) {
          bVar2 = false;
          if (plStack_38 != (lys_node *)0x0) {
            bVar2 = plStack_38->nodetype != LYS_INPUT;
          }
          if (!bVar2) break;
          plStack_38 = plStack_38->next;
        }
      }
      if ((plStack_38 != (lys_node *)0x0) &&
         (iVar1 = lyd_check_mandatory_subtree(root,root,root,plStack_38,0,options), iVar1 != 0)) {
        return 1;
      }
    }
  }
  else {
    if ((root == (lyd_node *)0x0) || (root->schema->nodetype != LYS_NOTIF)) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,"Subtree is not a single notification.");
      return 1;
    }
    if ((root->schema->child != (lys_node *)0x0) &&
       (iVar1 = lyd_check_mandatory_subtree(root,root,root,root->schema,0,options), iVar1 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
lyd_check_mandatory_tree(struct lyd_node *root, struct ly_ctx *ctx, const struct lys_module **modules, int mod_count,
                         int options)
{
    struct lys_node *siter;
    int i;

    assert(root || ctx);
    assert(!(options & LYD_OPT_ACT_NOTIF));

    if (options & (LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        /* no check is needed */
        return EXIT_SUCCESS;
    }

    if (!ctx) {
        /* get context */
        ctx = root->schema->module->ctx;
    }

    if (!(options & LYD_OPT_TYPEMASK) || (options & LYD_OPT_CONFIG)) {
        if (options & LYD_OPT_NOSIBLINGS) {
            if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
                return EXIT_FAILURE;
            }
        } else if (modules && mod_count) {
            for (i = 0; i < mod_count; ++i) {
                LY_TREE_FOR(modules[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        } else {
            for (i = (options & LYD_OPT_DATA_NO_YANGLIB) ? ctx->internal_module_count : ctx->internal_module_count - 1;
                 i < ctx->models.used;
                 i++) {
                /* skip not implemented and disabled modules */
                if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
                    continue;
                }
                LY_TREE_FOR(ctx->models.list[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        }
    } else if (options & LYD_OPT_NOTIF) {
        if (!root || (root->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single notification.");
            return EXIT_FAILURE;
        }
        if (root->schema->child && lyd_check_mandatory_subtree(root, root, root, root->schema, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) {
        if (!root || !(root->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single RPC/action/reply.");
            return EXIT_FAILURE;
        }
        if (options & LYD_OPT_RPC) {
            for (siter = root->schema->child; siter && siter->nodetype != LYS_INPUT; siter = siter->next);
        } else { /* LYD_OPT_RPCREPLY */
            for (siter = root->schema->child; siter && siter->nodetype != LYS_OUTPUT; siter = siter->next);
        }
        if (siter && lyd_check_mandatory_subtree(root, root, root, siter, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
            return EXIT_FAILURE;
        }
    } else {
        LOGINT(ctx);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}